

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O3

Fraig_NodeVec_t * Fraig_Dfs(Fraig_Man_t *pMan,int fEquiv)

{
  Fraig_NodeVec_t *vNodes;
  Fraig_NodeVec_t *pFVar1;
  long lVar2;
  
  pMan->nTravIds = pMan->nTravIds + 1;
  vNodes = Fraig_NodeVecAlloc(100);
  pFVar1 = pMan->vOutputs;
  if (0 < pFVar1->nSize) {
    lVar2 = 0;
    do {
      Fraig_Dfs_rec(pMan,(Fraig_Node_t *)((ulong)pFVar1->pArray[lVar2] & 0xfffffffffffffffe),vNodes,
                    fEquiv);
      lVar2 = lVar2 + 1;
      pFVar1 = pMan->vOutputs;
    } while (lVar2 < pFVar1->nSize);
  }
  return vNodes;
}

Assistant:

Fraig_NodeVec_t * Fraig_Dfs( Fraig_Man_t * pMan, int fEquiv )
{
    Fraig_NodeVec_t * vNodes;
    int i;
    pMan->nTravIds++;
    vNodes = Fraig_NodeVecAlloc( 100 );
    for ( i = 0; i < pMan->vOutputs->nSize; i++ )
        Fraig_Dfs_rec( pMan, Fraig_Regular(pMan->vOutputs->pArray[i]), vNodes, fEquiv );
    return vNodes;
}